

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O1

acmod_id_t * mk_phone_list(char **btw_mark,uint32 *n_phone,char **word,uint32 n_word,lexicon_t *lex)

{
  acmod_id_t *paVar1;
  lex_entry_t *plVar2;
  acmod_id_t *paVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  if (n_word == 0) {
    paVar3 = (acmod_id_t *)0x0;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0xa8,"Word sequence is empty\n");
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    do {
      plVar2 = lexicon_lookup(lex,word[uVar6]);
      if (plVar2 == (lex_entry_t *)0x0) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                ,0xb2,"Unable to lookup word \'%s\' in the dictionary\n",word[uVar6]);
        return (acmod_id_t *)0x0;
      }
      uVar8 = uVar8 + plVar2->phone_cnt;
      uVar6 = uVar6 + 1;
    } while (n_word != uVar6);
    paVar3 = (acmod_id_t *)
             __ckd_calloc__((ulong)uVar8,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                            ,0xbc);
    pcVar4 = (char *)__ckd_calloc__((ulong)uVar8,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                                    ,0xc1);
    uVar6 = 0;
    uVar7 = 0;
    do {
      plVar2 = lexicon_lookup(lex,word[uVar6]);
      if (plVar2->phone_cnt != 0) {
        if (plVar2->phone_cnt == 1) {
          uVar5 = 0;
        }
        else {
          paVar1 = plVar2->ci_acmod_id;
          uVar5 = 0;
          do {
            paVar3[uVar7 + (int)uVar5] = paVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar5 < plVar2->phone_cnt - 1);
          uVar7 = uVar7 + (int)uVar5;
        }
        paVar3[uVar7] = plVar2->ci_acmod_id[uVar5];
        pcVar4[uVar7] = '\x01';
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_word);
    *btw_mark = pcVar4;
    *n_phone = uVar8;
    if (uVar7 != uVar8) {
      __assert_fail("k == n_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                    ,0xd5,
                    "acmod_id_t *mk_phone_list(char **, uint32 *, char **, uint32, lexicon_t *)");
    }
  }
  return paVar3;
}

Assistant:

acmod_id_t *mk_phone_list(char **btw_mark,
			  uint32 *n_phone,
			  char **word,
			  uint32 n_word,
			  lexicon_t *lex)
{
    uint32 n_p;
    lex_entry_t *e;
    char *btw;
    unsigned int i, j, k;
    acmod_id_t *p;

    if (n_word == 0) {
	E_WARN("Word sequence is empty\n");
	return NULL;
    }

    /*
     * Determine the # of phones in the sequence.
     */
    for (i = 0, n_p = 0; i < n_word; i++) {
	e = lexicon_lookup(lex, word[i]);
	if (e == NULL) {
	    E_WARN("Unable to lookup word '%s' in the dictionary\n", word[i]);

	    return NULL;
	}
	n_p += e->phone_cnt;
    }

    /*
     * Allocate the phone sequence
     */
    p = ckd_calloc(n_p, sizeof(acmod_id_t));

    /*
     * Allocate the between word markers
     */
    btw = ckd_calloc(n_p, sizeof(char));

    for (i = 0, k = 0; i < n_word; i++) {	/* for each word */
	e = lexicon_lookup(lex, word[i]);
	if (e->phone_cnt == 0) /* Ignore words with no pronunciation */
	  continue;
	for (j = 0; j < e->phone_cnt-1; j++, k++) {	/* for all but the last phone in the word */
	    p[k] = e->ci_acmod_id[j];
	}
	p[k] = e->ci_acmod_id[j];	/* move over the last phone */

	btw[k] = TRUE;			/* mark word boundary following
					   kth phone */

	++k;
    }

    *btw_mark = btw;
    *n_phone = n_p;

    assert(k == n_p);

    return p;
}